

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_A_WeaponOffset(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  bool bVar1;
  bool local_62;
  bool local_5f;
  int local_5c;
  double dStack_58;
  int flags;
  double wy;
  double wx;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x3f5,"int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    self_00 = (AActor *)(param->field_0).field_1.a;
    local_5f = true;
    if (self_00 != (AActor *)0x0) {
      local_5f = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_5f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x3f5,"int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
        bVar1 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3f5,
                      "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      this = (DObject *)param[1].field_0.field_1.a;
      local_62 = true;
      if (this != (DObject *)0x0) {
        local_62 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      }
      if (local_62 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3f5,
                      "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
        bVar1 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3f5,
                      "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
      wy = 0.0;
    }
    else {
      if (param[3].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3f6,
                      "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      wy = param[3].field_0.f;
    }
    if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
      dStack_58 = 32.0;
    }
    else {
      if (param[4].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3f7,
                      "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      dStack_58 = param[4].field_0.f;
    }
    if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
      local_5c = 0;
    }
    else {
      if (param[5].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3f8,
                      "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      local_5c = param[5].field_0.i;
    }
    A_OverlayOffset(self_00,1,wy,dStack_58,local_5c);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x3f5,"int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WeaponOffset)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_FLOAT_OPT(wx) { wx = 0.; }
	PARAM_FLOAT_OPT(wy) { wy = 32.; }
	PARAM_INT_OPT(flags) { flags = 0; }
	A_OverlayOffset(self, PSP_WEAPON, wx, wy, flags);
	return 0;
}